

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEditPrivate::updateEdit(QDateTimeEditPrivate *this)

{
  QLineEdit *this_00;
  int length;
  bool bVar1;
  int iVar2;
  P _a;
  P _b;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate);
  if (bVar1) {
    local_58.d = (this->super_QAbstractSpinBoxPrivate).specialValueText.d.d;
    local_58.ptr = (this->super_QAbstractSpinBoxPrivate).specialValueText.d.ptr;
    local_58.size = (this->super_QAbstractSpinBoxPrivate).specialValueText.d.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xd8))
              (&local_58,this,&(this->super_QAbstractSpinBoxPrivate).value);
  }
  (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_70,this);
  bVar1 = ::comparesEqual((QString *)&local_58,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  if (!bVar1) {
    QLineEdit::selectedText((QString *)&local_70,(this->super_QAbstractSpinBoxPrivate).edit);
    length = (int)local_70.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)local_38,(QObject *)(this->super_QAbstractSpinBoxPrivate).edit);
    QLineEdit::setText((this->super_QAbstractSpinBoxPrivate).edit,(QString *)&local_58);
    bVar1 = QAbstractSpinBoxPrivate::specialValue(&this->super_QAbstractSpinBoxPrivate);
    if (!bVar1) {
      iVar2 = QDateTimeParser::sectionPos((int)this + 0x3d8);
      (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
                (&local_70,this);
      lVar3 = (long)iVar2;
      if (CONCAT44(local_70.size._4_4_,(int)local_70.size) < (long)iVar2) {
        lVar3 = CONCAT44(local_70.size._4_4_,(int)local_70.size);
      }
      lVar4 = 0;
      if (0 < lVar3) {
        lVar4 = lVar3;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      this_00 = (this->super_QAbstractSpinBoxPrivate).edit;
      if (length < 1) {
        QLineEdit::setCursorPosition(this_00,(int)lVar4);
      }
      else {
        QLineEdit::setSelection(this_00,(int)lVar4,length);
      }
    }
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_38);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateEdit()
{
    const QString newText = (specialValue() ? specialValueText : textFromValue(value));
    if (newText == displayText())
        return;
    int selsize = edit->selectedText().size();
    const QSignalBlocker blocker(edit);

    edit->setText(newText);

    if (!specialValue()
#ifdef QT_KEYPAD_NAVIGATION
        && !(QApplicationPrivate::keypadNavigationEnabled() && !edit->hasEditFocus())
#endif
            ) {
        int cursor = sectionPos(currentSectionIndex);
        QDTEDEBUG << "cursor is " << cursor << currentSectionIndex;
        cursor = qBound(0, cursor, displayText().size());
        QDTEDEBUG << cursor;
        if (selsize > 0) {
            edit->setSelection(cursor, selsize);
            QDTEDEBUG << cursor << selsize;
        } else {
            edit->setCursorPosition(cursor);
            QDTEDEBUG << cursor;

        }
    }
}